

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O1

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> __thiscall
bssl::CreateCertErrorParams2SizeT(bssl *this,char *name1,size_t value1,char *name2,size_t value2)

{
  undefined8 *puVar1;
  
  if ((name1 != (char *)0x0) && (name2 != (char *)0x0)) {
    puVar1 = (undefined8 *)operator_new(0x28);
    *puVar1 = &PTR__CertErrorParams_006e7778;
    puVar1[1] = name1;
    puVar1[2] = value1;
    puVar1[3] = name2;
    puVar1[4] = value2;
    *(undefined8 **)this = puVar1;
    return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
              )this;
  }
  abort();
}

Assistant:

OPENSSL_EXPORT std::unique_ptr<CertErrorParams> CreateCertErrorParams2SizeT(
    const char *name1, size_t value1, const char *name2, size_t value2) {
  BSSL_CHECK(name1);
  BSSL_CHECK(name2);
  return std::make_unique<CertErrorParams2SizeT>(name1, value1, name2, value2);
}